

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

void __thiscall MakefileGenerator::writeObj(MakefileGenerator *this,QTextStream *t,char *src)

{
  QMakeProject *pQVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  ProStringList *sources;
  QTextStream *pQVar5;
  undefined4 extraout_var;
  QList<ProString> *pQVar6;
  iterator other;
  iterator iVar7;
  iterator sub;
  iterator iVar8;
  CaseSensitivity CVar9;
  ProString *this_00;
  char16_t *pcVar10;
  ProString *this_01;
  ProString *compiler;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  ProString compilerSuffix;
  ProString extensionSuffix;
  ProKey comp;
  QStringBuilder<const_char_(&)[11],_ProString_&> local_168;
  undefined1 local_158 [32];
  undefined1 *puStack_138;
  undefined1 *local_130;
  undefined1 local_128 [32];
  undefined1 *puStack_108;
  undefined1 *local_100;
  undefined1 local_f8 [32];
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  QString local_c8;
  QString local_a8;
  QArrayDataPointer<ProString> local_88;
  undefined1 local_68 [28];
  int iStack_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)local_68,src);
  sources = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_68);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
  createObjectList((ProStringList *)&local_88,this,sources);
  if ((sources->super_QList<ProString>).d.size != 0) {
    this_01 = (sources->super_QList<ProString>).d.ptr;
    this_00 = local_88.ptr;
    do {
      if (this_00 == local_88.ptr + local_88.size) break;
      if (this_01->m_length != 0) {
        local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        ProString::toQString(&local_a8,this_01);
        local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        ProString::toQString(&local_c8,this_00);
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(local_f8,this,&local_c8)
        ;
        pQVar5 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_f8);
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,": ");
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                  ((ProString *)local_128,this,&local_a8);
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)local_128);
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," ");
        iVar4 = (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x10])(this,&local_a8)
        ;
        finalizeDependencyPaths
                  ((QStringList *)local_158,this,(QStringList *)CONCAT44(extraout_var,iVar4));
        QVar11.m_data = (storage_type *)0x5;
        QVar11.m_size = (qsizetype)local_68;
        QString::fromUtf8(QVar11);
        uVar2 = local_68._0_8_;
        pcVar10 = (char16_t *)local_68._8_8_;
        if ((char16_t *)local_68._8_8_ == (char16_t *)0x0) {
          pcVar10 = (char16_t *)&QString::_empty;
        }
        QtPrivate::QStringList_join((QList *)local_68,(QChar *)local_158,(longlong)pcVar10);
        QTextStream::operator<<(pQVar5,(QString *)local_68);
        if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)uVar2 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar2)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar2,2,0x10);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_158);
        if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
          }
        }
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ProString::ProString((ProString *)local_68);
        pQVar1 = this->project;
        ProKey::ProKey((ProKey *)local_f8,"QMAKE_BUILTIN_COMPILERS");
        pQVar6 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_f8)->
                  super_QList<ProString>;
        if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
          }
        }
        other = QList<ProString>::begin(pQVar6);
        iVar7 = QList<ProString>::end(pQVar6);
        for (; other.i != iVar7.i; other.i = other.i + 1) {
          local_d8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          ProString::ProString((ProString *)local_f8,other.i);
          bVar3 = ProString::operator==((ProString *)local_f8,"CXX");
          if (bVar3) {
            ProString::ProString((ProString *)local_128,"CPP");
            QString::operator=((QString *)local_f8,(QString *)local_128);
            puStack_d0 = local_100;
            local_f8._24_8_ = local_128._24_8_;
            local_d8 = puStack_108;
            if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
              }
            }
          }
          puStack_108 = &DAT_aaaaaaaaaaaaaaaa;
          local_100 = &DAT_aaaaaaaaaaaaaaaa;
          local_128._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_128._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          ProString::ProString((ProString *)local_128,other.i);
          bVar3 = ProString::operator==((ProString *)local_128,"C");
          if (bVar3) {
            ProString::ProString((ProString *)local_158,"CC");
            QString::operator=((QString *)local_128,(QString *)local_158);
            local_100 = local_130;
            local_128._24_8_ = local_158._24_8_;
            puStack_108 = puStack_138;
            if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_158._0_8_,2,0x10);
              }
            }
          }
          pQVar1 = this->project;
          local_168.a = (char (*) [11])0x2a8a56;
          local_168.b = (ProString *)local_f8;
          ProString::ProString<char_const(&)[11],ProString&>((ProString *)local_158,&local_168);
          pQVar6 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_158)->
                    super_QList<ProString>;
          if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_158._0_8_,2,0x10);
            }
          }
          sub = QList<ProString>::begin(pQVar6);
          iVar8 = QList<ProString>::end(pQVar6);
          for (; sub.i != iVar8.i; sub.i = sub.i + 1) {
            bVar3 = ProString::endsWith(this_01,sub.i,CaseSensitive);
            if (bVar3) {
              local_168.a = (char (*) [11])0x2a8a61;
              local_168.b = (ProString *)local_128;
              ProString::ProString<char_const(&)[11],ProString&>((ProString *)local_158,&local_168);
              QString::operator=((QString *)local_68,(QString *)local_158);
              puStack_40 = local_130;
              stack0xffffffffffffffb0 = (undefined1 *)local_158._24_8_;
              local_48 = puStack_138;
              if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_158._0_8_,2,0x10);
                }
              }
              break;
            }
          }
          uVar2 = local_68._8_8_;
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
            }
          }
          if ((char16_t *)uVar2 != (char16_t *)0x0) break;
        }
        if (iStack_4c == 0) {
          ProKey::ProKey((ProKey *)local_f8,"QMAKE_RUN_CC");
          QString::operator=((QString *)local_68,(QString *)local_f8);
          puStack_40 = puStack_d0;
          unique0x1000086e = (undefined1 *)local_f8._24_8_;
          local_48 = local_d8;
          if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
            }
          }
        }
        bVar3 = QMakeProject::isEmpty(this->project,(ProKey *)local_68);
        if (!bVar3) {
          local_f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                    ((ProKey *)local_f8,this,local_68);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                    ((ProString *)local_128,this,&local_a8);
          QVar12.m_data = (char *)0x4;
          QVar12.m_size = (qsizetype)local_f8;
          CVar9 = (CaseSensitivity)(ProString *)local_128;
          QString::replace(QVar12,(QString *)0x2aa45a,CVar9);
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
            }
          }
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                    ((ProString *)local_128,this,&local_c8);
          QVar13.m_data = (char *)0x4;
          QVar13.m_size = (qsizetype)local_f8;
          QString::replace(QVar13,(QString *)"$obj",CVar9);
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
            }
          }
          pQVar5 = (QTextStream *)QTextStream::operator<<(t,"\n\t");
          QTextStream::operator<<(pQVar5,(QString *)local_f8);
          if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
            }
          }
        }
        pQVar5 = (QTextStream *)Qt::endl(t);
        Qt::endl(pQVar5);
        if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
        if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      this_00 = this_00 + 1;
      this_01 = this_01 + 1;
    } while (this_01 !=
             (sources->super_QList<ProString>).d.ptr + (sources->super_QList<ProString>).d.size);
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeObj(QTextStream &t, const char *src)
{
    const ProStringList &srcl = project->values(src);
    const ProStringList objl = createObjectList(srcl);

    ProStringList::ConstIterator oit = objl.begin();
    ProStringList::ConstIterator sit = srcl.begin();
    QLatin1String stringSrc("$src");
    QLatin1String stringObj("$obj");
    for(;sit != srcl.end() && oit != objl.end(); ++oit, ++sit) {
        if((*sit).isEmpty())
            continue;

        QString srcf = (*sit).toQString();
        QString dstf = (*oit).toQString();
        t << escapeDependencyPath(dstf) << ": " << escapeDependencyPath(srcf)
          << " " << finalizeDependencyPaths(findDependencies(srcf)).join(" \\\n\t\t");

        ProKey comp;
        for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
            // Unfortunately we were not consistent about the C++ naming
            ProString extensionSuffix = compiler;
            if (extensionSuffix == "CXX")
                extensionSuffix = ProString("CPP");

            // Nor the C naming
            ProString compilerSuffix = compiler;
            if (compilerSuffix == "C")
                compilerSuffix = ProString("CC");

            for (const ProString &extension : project->values(ProKey("QMAKE_EXT_" + extensionSuffix))) {
                if ((*sit).endsWith(extension)) {
                    comp = ProKey("QMAKE_RUN_" + compilerSuffix);
                    break;
                }
            }

            if (!comp.isNull())
                break;
        }

        if (comp.isEmpty())
            comp = "QMAKE_RUN_CC";
        if (!project->isEmpty(comp)) {
            QString p = var(comp);
            p.replace(stringSrc, escapeFilePath(srcf));
            p.replace(stringObj, escapeFilePath(dstf));
            t << "\n\t" << p;
        }
        t << Qt::endl << Qt::endl;
    }
}